

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_armor.cpp
# Opt level: O1

AInventory * __thiscall AHexenArmor::CreateCopy(AHexenArmor *this,AActor *other)

{
  AHexenArmor *this_00;
  AActor *actor;
  _func_int **local_28;
  PClass *pPStack_20;
  DObject *local_18;
  
  actor = (AActor *)&stack0xffffffffffffffd8;
  local_28 = (_func_int **)0x0;
  pPStack_20 = (PClass *)0x0;
  local_18 = (DObject *)0x0;
  this_00 = (AHexenArmor *)
            AActor::StaticSpawn((PClassActor *)RegistrationInfo.MyClass,
                                (DVector3 *)&stack0xffffffffffffffd8,NO_REPLACE,false);
  AddArmorToSlot(this_00,actor,(this->super_AArmor).super_AInventory.super_AActor.health,
                 (this->super_AArmor).super_AInventory.Amount);
  (*(this->super_AArmor).super_AInventory.super_AActor.super_DThinker.super_DObject._vptr_DObject
    [0x36])(this);
  return (AInventory *)this_00;
}

Assistant:

AInventory *AHexenArmor::CreateCopy (AActor *other)
{
	// Like BasicArmor, HexenArmor is used in the inventory but not the map.
	// health is the slot this armor occupies.
	// Amount is the quantity to give (0 = normal max).
	AHexenArmor *copy = Spawn<AHexenArmor> ();
	copy->AddArmorToSlot (other, health, Amount);
	GoAwayAndDie ();
	return copy;
}